

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Reader capnp::DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(Reader *reader)

{
  uchar *puVar1;
  size_t sVar2;
  Reader RVar3;
  Fault f;
  Fault local_18;
  
  if (reader->type == TEXT) {
    puVar1 = (uchar *)(reader->field_1).intValue;
    sVar2 = (reader->field_1).textValue.super_StringPtr.content.size_ - 1;
  }
  else if (reader->type == DATA) {
    puVar1 = (uchar *)(reader->field_1).intValue;
    sVar2 = (reader->field_1).textValue.super_StringPtr.content.size_;
  }
  else {
    sVar2 = 0;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x736,FAILED,"reader.type == DATA","\"Value type mismatch.\"",
               (char (*) [21])"Value type mismatch.");
    kj::_::Debug::Fault::~Fault(&local_18);
    puVar1 = (uchar *)0x0;
  }
  RVar3.super_ArrayPtr<const_unsigned_char>.size_ = sVar2;
  RVar3.super_ArrayPtr<const_unsigned_char>.ptr = puVar1;
  return (Reader)RVar3.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

Data::Reader DynamicValue::Reader::AsImpl<Data>::apply(const Reader& reader) {
  if (reader.type == TEXT) {
    // Coerce text to data.
    return reader.textValue.asBytes();
  }
  KJ_REQUIRE(reader.type == DATA, "Value type mismatch.") {
    return Data::Reader();
  }
  return reader.dataValue;
}